

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O0

void cmSHA512_Internal_Transform(SHA_CTX *context,sha_word64 *data)

{
  sha_word64 sVar1;
  sha_word64 sVar2;
  sha_word64 sVar3;
  sha_word64 sVar4;
  ulong uVar5;
  long lVar6;
  sha_word64 sVar7;
  sha_word64 sVar8;
  ulong uVar9;
  ulong uVar10;
  sha_word64 tmp;
  int j;
  sha_word64 *W512;
  sha_word64 T2;
  sha_word64 T1;
  sha_word64 s1;
  sha_word64 s0;
  sha_word64 h;
  sha_word64 g;
  sha_word64 f;
  sha_word64 e;
  sha_word64 d;
  sha_word64 c;
  sha_word64 b;
  sha_word64 a;
  sha_word64 *data_local;
  SHA_CTX *context_local;
  
  b = (context->s512).state[0];
  c = (context->s512).state[1];
  d = (context->s512).state[2];
  e = (context->s1).bitcount;
  f = (context->s256).bitcount;
  g = (context->s512).state[5];
  h = (context->s512).state[6];
  s0 = (context->s512).state[7];
  tmp._4_4_ = 0;
  a = (sha_word64)data;
  do {
    uVar5 = *(ulong *)a >> 0x20 | *(ulong *)a << 0x20;
    uVar5 = (uVar5 & 0xff00ff00ff00ff00) >> 8 | (uVar5 & 0xff00ff00ff00ff) << 8;
    *(ulong *)((long)context + (long)(int)tmp._4_4_ * 8 + 0x50) =
         (uVar5 & 0xffff0000ffff0000) >> 0x10 | (uVar5 & 0xffff0000ffff) << 0x10;
    lVar6 = s0 + ((f >> 0xe | f << 0x32) ^ (f >> 0x12 | f << 0x2e) ^ (f >> 0x29 | f << 0x17)) +
            (f & g ^ (f ^ 0xffffffffffffffff) & h) + K512[(int)tmp._4_4_] +
            *(long *)((long)context + (long)(int)tmp._4_4_ * 8 + 0x50);
    uVar5 = b & c;
    uVar9 = b & d;
    uVar10 = c & d;
    s0 = h;
    h = g;
    g = f;
    f = e + lVar6;
    e = d;
    d = c;
    c = b;
    b = lVar6 + ((b >> 0x1c | b << 0x24) ^ (b >> 0x22 | b << 0x1e) ^ (b >> 0x27 | b << 0x19)) +
                (uVar5 ^ uVar9 ^ uVar10);
    tmp._4_4_ = tmp._4_4_ + 1;
    sVar1 = h;
    sVar2 = g;
    sVar7 = f;
    sVar3 = d;
    sVar4 = c;
    sVar8 = b;
    a = a + 8;
  } while ((int)tmp._4_4_ < 0x10);
  do {
    b = sVar8;
    c = sVar4;
    d = sVar3;
    f = sVar7;
    g = sVar2;
    h = sVar1;
    uVar5 = *(ulong *)((long)context + (long)(int)(tmp._4_4_ + 1 & 0xf) * 8 + 0x50);
    uVar9 = *(ulong *)((long)context + (long)(int)(tmp._4_4_ + 0xe & 0xf) * 8 + 0x50);
    sVar1 = K512[(int)tmp._4_4_];
    lVar6 = ((uVar9 >> 0x13 | uVar9 << 0x2d) ^ (uVar9 >> 0x3d | uVar9 << 3) ^ uVar9 >> 6) +
            *(long *)((long)context + (long)(int)(tmp._4_4_ + 9 & 0xf) * 8 + 0x50) +
            ((uVar5 >> 1 | uVar5 << 0x3f) ^ (uVar5 >> 8 | uVar5 << 0x38) ^ uVar5 >> 7) +
            *(long *)((long)context + (long)(int)(tmp._4_4_ & 0xf) * 8 + 0x50);
    *(long *)((long)context + (long)(int)(tmp._4_4_ & 0xf) * 8 + 0x50) = lVar6;
    lVar6 = s0 + ((f >> 0xe | f << 0x32) ^ (f >> 0x12 | f << 0x2e) ^ (f >> 0x29 | f << 0x17)) +
            (f & g ^ (f ^ 0xffffffffffffffff) & h) + sVar1 + lVar6;
    s0 = h;
    sVar7 = e + lVar6;
    e = d;
    sVar8 = lVar6 + ((b >> 0x1c | b << 0x24) ^ (b >> 0x22 | b << 0x1e) ^ (b >> 0x27 | b << 0x19)) +
                    (b & c ^ b & d ^ c & d);
    tmp._4_4_ = tmp._4_4_ + 1;
    sVar1 = g;
    sVar2 = f;
    sVar3 = c;
    sVar4 = b;
  } while ((int)tmp._4_4_ < 0x50);
  (context->s512).state[0] = sVar8 + (context->s512).state[0];
  (context->s512).state[1] = b + (context->s512).state[1];
  (context->s512).state[2] = c + (context->s512).state[2];
  (context->s1).bitcount = d + (context->s1).bitcount;
  (context->s256).bitcount = sVar7 + (context->s256).bitcount;
  (context->s512).state[5] = f + (context->s512).state[5];
  (context->s512).state[6] = g + (context->s512).state[6];
  (context->s512).state[7] = h + (context->s512).state[7];
  return;
}

Assistant:

void SHA512_Internal_Transform(SHA_CTX* context, const sha_word64* data) {
	sha_word64	a, b, c, d, e, f, g, h, s0, s1;
	sha_word64	T1, T2, *W512 = (sha_word64*)context->s512.buffer;
	int		j;

	/* Initialize registers with the prev. intermediate value */
	a = context->s512.state[0];
	b = context->s512.state[1];
	c = context->s512.state[2];
	d = context->s512.state[3];
	e = context->s512.state[4];
	f = context->s512.state[5];
	g = context->s512.state[6];
	h = context->s512.state[7];

	j = 0;
	do {
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert TO host byte order */
		REVERSE64(*data++, W512[j]);
		/* Apply the SHA-512 compression function to update a..h */
		T1 = h + Sigma1_512(e) + Ch(e, f, g) + K512[j] + W512[j];
#else /* BYTE_ORDER == LITTLE_ENDIAN */
		/* Apply the SHA-512 compression function to update a..h with copy */
		T1 = h + Sigma1_512(e) + Ch(e, f, g) + K512[j] + (W512[j] = *data++);
#endif /* BYTE_ORDER == LITTLE_ENDIAN */
		T2 = Sigma0_512(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 16);

	do {
		/* Part of the message block expansion: */
		s0 = W512[(j+1)&0x0f];
		s0 = sigma0_512(s0);
		s1 = W512[(j+14)&0x0f];
		s1 =  sigma1_512(s1);

		/* Apply the SHA-512 compression function to update a..h */
		T1 = h + Sigma1_512(e) + Ch(e, f, g) + K512[j] +
		     (W512[j&0x0f] += s1 + W512[(j+9)&0x0f] + s0);
		T2 = Sigma0_512(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 80);

	/* Compute the current intermediate hash value */
	context->s512.state[0] += a;
	context->s512.state[1] += b;
	context->s512.state[2] += c;
	context->s512.state[3] += d;
	context->s512.state[4] += e;
	context->s512.state[5] += f;
	context->s512.state[6] += g;
	context->s512.state[7] += h;

	/* Clean up */
	a = b = c = d = e = f = g = h = T1 = T2 = 0;
}